

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZString.cpp
# Opt level: O0

wstring * __thiscall
lzstring::LZString::Compress
          (wstring *__return_storage_ptr__,LZString *this,wstring *input,int bitsPerChar,
          GetCharFromIntFunc *func)

{
  key_type *__x;
  wchar_t __c;
  bool bVar1;
  ulong uVar2;
  wchar_t *pwVar3;
  mapped_type *pmVar4;
  int *piVar5;
  uint *puVar6;
  mapped_type *pmVar7;
  wchar_t wVar8;
  double dVar9;
  ulong local_200;
  size_t i_11;
  size_t i_10;
  size_t i_9;
  size_t i_8;
  size_t i_7;
  size_t i_6;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_true>
  local_1c8;
  ulong local_1c0;
  size_t i_5;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_true>
  local_190;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_true>
  local_188;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_true>
  local_180;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_178;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_true>
  local_158;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>,_true>
  local_150 [3];
  allocator<wchar_t> local_131;
  undefined1 local_130 [8];
  wstring contextStr;
  ulong uStack_108;
  wchar_t contextC;
  size_t index;
  int contextDataPosition;
  int contextDataVal;
  int local_f0;
  int contextNumBits;
  int contextDictSize;
  int contextEnlargeIn;
  wstring contextW;
  wstring contextWc;
  StringFlagDict contextFlagDict;
  StringDict contextDict;
  int value;
  int i;
  GetCharFromIntFunc *func_local;
  int bitsPerChar_local;
  wstring *input_local;
  LZString *this_local;
  wstring *contextData;
  
  uVar2 = std::__cxx11::wstring::empty();
  if ((uVar2 & 1) == 0) {
    std::
    unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>_>
                     *)&contextFlagDict._M_h._M_single_bucket);
    std::
    unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>_>
                     *)((long)&contextWc.field_2 + 8));
    std::__cxx11::wstring::wstring((wstring *)((long)&contextW.field_2 + 8));
    std::__cxx11::wstring::wstring((wstring *)&contextDictSize);
    contextNumBits = 2;
    local_f0 = 3;
    contextDataVal = 2;
    std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
    index._4_4_ = 0;
    index._0_4_ = 0;
    uStack_108 = 0;
    while( true ) {
      uVar2 = std::__cxx11::wstring::size();
      wVar8 = (wchar_t)__return_storage_ptr__;
      if (uVar2 <= uStack_108) break;
      pwVar3 = (wchar_t *)std::__cxx11::wstring::operator[]((ulong)input);
      __c = *pwVar3;
      contextStr.field_2._M_local_buf[3] = __c;
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_130,1,__c,&local_131)
      ;
      std::allocator<wchar_t>::~allocator(&local_131);
      local_150[0]._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>_>
                   *)&contextFlagDict._M_h._M_single_bucket,(key_type *)local_130);
      local_158._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>_>
                  *)&contextFlagDict._M_h._M_single_bucket);
      bVar1 = std::__detail::operator==(local_150,&local_158);
      if (bVar1) {
        pmVar7 = std::
                 unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>_>
                               *)&contextFlagDict._M_h._M_single_bucket,(key_type *)local_130);
        *pmVar7 = local_f0;
        pmVar4 = std::
                 unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>_>
                               *)((long)&contextWc.field_2 + 8),(key_type *)local_130);
        *pmVar4 = true;
        local_f0 = local_f0 + 1;
      }
      std::operator+(&local_178,
                     (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     &contextDictSize,contextStr.field_2._M_local_buf[3]);
      __x = (key_type *)((long)&contextW.field_2 + 8);
      std::__cxx11::wstring::operator=((wstring *)__x,(wstring *)&local_178);
      std::__cxx11::wstring::~wstring((wstring *)&local_178);
      local_180._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>_>
                   *)&contextFlagDict._M_h._M_single_bucket,__x);
      local_188._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>_>
                  *)&contextFlagDict._M_h._M_single_bucket);
      bVar1 = std::__detail::operator!=(&local_180,&local_188);
      if (bVar1) {
        std::__cxx11::wstring::operator=
                  ((wstring *)&contextDictSize,(wstring *)((long)&contextW.field_2 + 8));
      }
      else {
        local_190._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>_>
                     *)((long)&contextWc.field_2 + 8),(key_type *)&contextDictSize);
        i_1 = (size_t)std::
                      unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>_>
                      ::end((unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>_>
                             *)((long)&contextWc.field_2 + 8));
        bVar1 = std::__detail::operator!=
                          (&local_190,
                           (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_true>
                            *)&i_1);
        if (bVar1) {
          piVar5 = (int *)std::__cxx11::wstring::operator[]((ulong)&contextDictSize);
          if (*piVar5 < 0x100) {
            for (i_2 = 0; i_2 < (ulong)(long)contextDataVal; i_2 = i_2 + 1) {
              index._4_4_ = index._4_4_ << 1;
              if ((int)index == bitsPerChar + -1) {
                index._0_4_ = 0;
                std::function<wchar_t_(int)>::operator()(func,index._4_4_);
                std::__cxx11::wstring::push_back(wVar8);
                index._4_4_ = 0;
              }
              else {
                index._0_4_ = (int)index + 1;
              }
            }
            puVar6 = (uint *)std::__cxx11::wstring::operator[]((ulong)&contextDictSize);
            contextDict._M_h._M_single_bucket._0_4_ = *puVar6;
            for (i_3 = 0; i_3 < 8; i_3 = i_3 + 1) {
              index._4_4_ = index._4_4_ << 1 | (uint)contextDict._M_h._M_single_bucket & 1;
              if ((int)index == bitsPerChar + -1) {
                index._0_4_ = 0;
                std::function<wchar_t_(int)>::operator()(func,index._4_4_);
                std::__cxx11::wstring::push_back(wVar8);
                index._4_4_ = 0;
              }
              else {
                index._0_4_ = (int)index + 1;
              }
              contextDict._M_h._M_single_bucket._0_4_ =
                   (int)(uint)contextDict._M_h._M_single_bucket >> 1;
            }
          }
          else {
            contextDict._M_h._M_single_bucket._0_4_ = 1;
            for (i_4 = 0; i_4 < (ulong)(long)contextDataVal; i_4 = i_4 + 1) {
              index._4_4_ = index._4_4_ << 1 | (uint)contextDict._M_h._M_single_bucket;
              if ((int)index == bitsPerChar + -1) {
                index._0_4_ = 0;
                std::function<wchar_t_(int)>::operator()(func,index._4_4_);
                std::__cxx11::wstring::push_back(wVar8);
                index._4_4_ = 0;
              }
              else {
                index._0_4_ = (int)index + 1;
              }
              contextDict._M_h._M_single_bucket._0_4_ = 0;
            }
            puVar6 = (uint *)std::__cxx11::wstring::operator[]((ulong)&contextDictSize);
            contextDict._M_h._M_single_bucket._0_4_ = *puVar6;
            for (i_5 = 0; i_5 < 0x10; i_5 = i_5 + 1) {
              index._4_4_ = index._4_4_ << 1 | (uint)contextDict._M_h._M_single_bucket & 1;
              if ((int)index == bitsPerChar + -1) {
                index._0_4_ = 0;
                std::function<wchar_t_(int)>::operator()(func,index._4_4_);
                std::__cxx11::wstring::push_back(wVar8);
                index._4_4_ = 0;
              }
              else {
                index._0_4_ = (int)index + 1;
              }
              contextDict._M_h._M_single_bucket._0_4_ =
                   (int)(uint)contextDict._M_h._M_single_bucket >> 1;
            }
          }
          contextNumBits = contextNumBits + -1;
          if (contextNumBits == 0) {
            dVar9 = pow(2.0,(double)contextDataVal);
            contextNumBits = (int)dVar9;
            contextDataVal = contextDataVal + 1;
          }
          std::
          unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>_>
          ::erase((unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>_>
                   *)((long)&contextWc.field_2 + 8),(key_type *)&contextDictSize);
        }
        else {
          puVar6 = (uint *)std::
                           unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>_>
                           ::operator[]((unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>_>
                                         *)&contextFlagDict._M_h._M_single_bucket,
                                        (key_type *)&contextDictSize);
          contextDict._M_h._M_single_bucket._0_4_ = *puVar6;
          for (local_1c0 = 0; local_1c0 < (ulong)(long)contextDataVal; local_1c0 = local_1c0 + 1) {
            index._4_4_ = index._4_4_ << 1 | (uint)contextDict._M_h._M_single_bucket & 1;
            if ((int)index == bitsPerChar + -1) {
              index._0_4_ = 0;
              std::function<wchar_t_(int)>::operator()(func,index._4_4_);
              std::__cxx11::wstring::push_back(wVar8);
              index._4_4_ = 0;
            }
            else {
              index._0_4_ = (int)index + 1;
            }
            contextDict._M_h._M_single_bucket._0_4_ =
                 (int)(uint)contextDict._M_h._M_single_bucket >> 1;
          }
        }
        contextNumBits = contextNumBits + -1;
        if (contextNumBits == 0) {
          dVar9 = pow(2.0,(double)contextDataVal);
          contextNumBits = (int)dVar9;
          contextDataVal = contextDataVal + 1;
        }
        pmVar7 = std::
                 unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>_>
                               *)&contextFlagDict._M_h._M_single_bucket,
                              (key_type *)((long)&contextW.field_2 + 8));
        *pmVar7 = local_f0;
        std::__cxx11::wstring::operator=((wstring *)&contextDictSize,(wstring *)local_130);
        local_f0 = local_f0 + 1;
      }
      std::__cxx11::wstring::~wstring((wstring *)local_130);
      uStack_108 = uStack_108 + 1;
    }
    uVar2 = std::__cxx11::wstring::empty();
    if ((uVar2 & 1) == 0) {
      local_1c8._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>_>
                   *)((long)&contextWc.field_2 + 8),(key_type *)&contextDictSize);
      i_6 = (size_t)std::
                    unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>_>
                    ::end((unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>_>
                           *)((long)&contextWc.field_2 + 8));
      bVar1 = std::__detail::operator!=
                        (&local_1c8,
                         (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>,_true>
                          *)&i_6);
      if (bVar1) {
        piVar5 = (int *)std::__cxx11::wstring::operator[]((ulong)&contextDictSize);
        if (*piVar5 < 0x100) {
          for (i_7 = 0; i_7 < (ulong)(long)contextDataVal; i_7 = i_7 + 1) {
            index._4_4_ = index._4_4_ << 1;
            if ((int)index == bitsPerChar + -1) {
              index._0_4_ = 0;
              std::function<wchar_t_(int)>::operator()(func,index._4_4_);
              std::__cxx11::wstring::push_back(wVar8);
              index._4_4_ = 0;
            }
            else {
              index._0_4_ = (int)index + 1;
            }
          }
          puVar6 = (uint *)std::__cxx11::wstring::operator[]((ulong)&contextDictSize);
          contextDict._M_h._M_single_bucket._0_4_ = *puVar6;
          for (i_8 = 0; i_8 < 8; i_8 = i_8 + 1) {
            index._4_4_ = index._4_4_ << 1 | (uint)contextDict._M_h._M_single_bucket & 1;
            if ((int)index == bitsPerChar + -1) {
              index._0_4_ = 0;
              std::function<wchar_t_(int)>::operator()(func,index._4_4_);
              std::__cxx11::wstring::push_back(wVar8);
              index._4_4_ = 0;
            }
            else {
              index._0_4_ = (int)index + 1;
            }
            contextDict._M_h._M_single_bucket._0_4_ =
                 (int)(uint)contextDict._M_h._M_single_bucket >> 1;
          }
        }
        else {
          contextDict._M_h._M_single_bucket._0_4_ = 1;
          for (i_9 = 0; i_9 < (ulong)(long)contextDataVal; i_9 = i_9 + 1) {
            index._4_4_ = index._4_4_ << 1 | (uint)contextDict._M_h._M_single_bucket;
            if ((int)index == bitsPerChar + -1) {
              index._0_4_ = 0;
              std::function<wchar_t_(int)>::operator()(func,index._4_4_);
              std::__cxx11::wstring::push_back(wVar8);
              index._4_4_ = 0;
            }
            else {
              index._0_4_ = (int)index + 1;
            }
            contextDict._M_h._M_single_bucket._0_4_ = 0;
          }
          puVar6 = (uint *)std::__cxx11::wstring::operator[]((ulong)&contextDictSize);
          contextDict._M_h._M_single_bucket._0_4_ = *puVar6;
          for (i_10 = 0; i_10 < 0x10; i_10 = i_10 + 1) {
            index._4_4_ = index._4_4_ << 1 | (uint)contextDict._M_h._M_single_bucket & 1;
            if ((int)index == bitsPerChar + -1) {
              index._0_4_ = 0;
              std::function<wchar_t_(int)>::operator()(func,index._4_4_);
              std::__cxx11::wstring::push_back(wVar8);
              index._4_4_ = 0;
            }
            else {
              index._0_4_ = (int)index + 1;
            }
            contextDict._M_h._M_single_bucket._0_4_ =
                 (int)(uint)contextDict._M_h._M_single_bucket >> 1;
          }
        }
        contextNumBits = contextNumBits + -1;
        if (contextNumBits == 0) {
          dVar9 = pow(2.0,(double)contextDataVal);
          contextNumBits = (int)dVar9;
          contextDataVal = contextDataVal + 1;
        }
        std::
        unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>_>
        ::erase((unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>_>
                 *)((long)&contextWc.field_2 + 8),(key_type *)&contextDictSize);
      }
      else {
        puVar6 = (uint *)std::
                         unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>_>
                         ::operator[]((unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>_>
                                       *)&contextFlagDict._M_h._M_single_bucket,
                                      (key_type *)&contextDictSize);
        contextDict._M_h._M_single_bucket._0_4_ = *puVar6;
        for (i_11 = 0; i_11 < (ulong)(long)contextDataVal; i_11 = i_11 + 1) {
          index._4_4_ = index._4_4_ << 1 | (uint)contextDict._M_h._M_single_bucket & 1;
          if ((int)index == bitsPerChar + -1) {
            index._0_4_ = 0;
            std::function<wchar_t_(int)>::operator()(func,index._4_4_);
            std::__cxx11::wstring::push_back(wVar8);
            index._4_4_ = 0;
          }
          else {
            index._0_4_ = (int)index + 1;
          }
          contextDict._M_h._M_single_bucket._0_4_ =
               (int)(uint)contextDict._M_h._M_single_bucket >> 1;
        }
      }
      if (contextNumBits == 1) {
        pow(2.0,(double)contextDataVal);
        contextDataVal = contextDataVal + 1;
      }
    }
    contextDict._M_h._M_single_bucket._0_4_ = 2;
    for (local_200 = 0; local_200 < (ulong)(long)contextDataVal; local_200 = local_200 + 1) {
      index._4_4_ = index._4_4_ << 1 | (uint)contextDict._M_h._M_single_bucket & 1;
      if ((int)index == bitsPerChar + -1) {
        index._0_4_ = 0;
        std::function<wchar_t_(int)>::operator()(func,index._4_4_);
        std::__cxx11::wstring::push_back(wVar8);
        index._4_4_ = 0;
      }
      else {
        index._0_4_ = (int)index + 1;
      }
      contextDict._M_h._M_single_bucket._0_4_ = (int)(uint)contextDict._M_h._M_single_bucket >> 1;
    }
    for (; index._4_4_ = index._4_4_ << 1, (int)index != bitsPerChar + -1;
        index._0_4_ = (int)index + 1) {
    }
    std::function<wchar_t_(int)>::operator()(func,index._4_4_);
    std::__cxx11::wstring::push_back(wVar8);
    std::__cxx11::wstring::~wstring((wstring *)&contextDictSize);
    std::__cxx11::wstring::~wstring((wstring *)((long)&contextW.field_2 + 8));
    std::
    unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_bool>_>_>
                      *)((long)&contextWc.field_2 + 8));
    std::
    unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_int>_>_>
                      *)&contextFlagDict._M_h._M_single_bucket);
  }
  else {
    std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring LZString::Compress(const std::wstring &input, const int bitsPerChar, GetCharFromIntFunc func)
{
	if (input.empty())
		return std::wstring();

	int i = 0, value = 0;
	StringDict contextDict;
	StringFlagDict contextFlagDict;
	std::wstring contextWc;
	std::wstring contextW;
	int contextEnlargeIn = 2; // Compensate for the first entry which should not count
	int contextDictSize = 3;
	int contextNumBits = 2;
	std::wstring contextData;
	int contextDataVal = 0;
	int contextDataPosition = 0;

	for (size_t index = 0; index < input.size(); index++)
	{
		wchar_t contextC = input[index];
		std::wstring contextStr = std::wstring(1, contextC);
		if (contextDict.find(contextStr) == contextDict.end())
		{
			contextDict[contextStr] = contextDictSize++;
			contextFlagDict[contextStr] = true;
		}

		contextWc = contextW + contextC;
		if (contextDict.find(contextWc) != contextDict.end())
		{
			contextW = contextWc;
		}
		else
		{
			if (contextFlagDict.find(contextW) != contextFlagDict.end())
			{
				if ((int)contextW[0] < 256)
				{
					for (size_t i = 0; i < contextNumBits; i++)
					{
						contextDataVal = (contextDataVal << 1);
						if (contextDataPosition == bitsPerChar - 1)
						{
							contextDataPosition = 0;
							contextData.push_back(func(contextDataVal));
							contextDataVal = 0;
						}
						else
						{
							contextDataPosition++;
						}
					}

					value = contextW[0];
					for (size_t i = 0; i < 8; i++)
					{
						contextDataVal = (contextDataVal << 1) | (value & 1);
						if (contextDataPosition == bitsPerChar - 1)
						{
							contextDataPosition = 0;
							contextData.push_back(func(contextDataVal));
							contextDataVal = 0;
						}
						else
						{
							contextDataPosition++;
						}
						value = value >> 1;
					}
				}
				else
				{
					value = 1;
					for (size_t i = 0; i < contextNumBits; i++)
					{
						contextDataVal = (contextDataVal << 1) | value;
						if (contextDataPosition == bitsPerChar - 1)
						{
							contextDataPosition = 0;
							contextData.push_back(func(contextDataVal));
							contextDataVal = 0;
						}
						else
						{
							contextDataPosition++;
						}
						value = 0;
					}

					value = contextW[0];
					for (size_t i = 0; i < 16; i++)
					{
						contextDataVal = (contextDataVal << 1) | (value & 1);
						if (contextDataPosition == bitsPerChar - 1)
						{
							contextDataPosition = 0;
							contextData.push_back(func(contextDataVal));
							contextDataVal = 0;
						}
						else
						{
							contextDataPosition++;
						}
						value = value >> 1;
					}
				}
				contextEnlargeIn--;
				if (contextEnlargeIn == 0)
				{
					contextEnlargeIn = (int)pow(2, contextNumBits);
					contextNumBits++;
				}
				contextFlagDict.erase(contextW);
			}
			else
			{
				value = contextDict[contextW];
				for (size_t i = 0; i < contextNumBits; i++)
				{
					contextDataVal = (contextDataVal << 1) | (value & 1);
					if (contextDataPosition == bitsPerChar - 1)
					{
						contextDataPosition = 0;
						contextData.push_back(func(contextDataVal));
						contextDataVal = 0;
					}
					else
					{
						contextDataPosition++;
					}
					value = value >> 1;
				}
			}
			contextEnlargeIn--;
			if (contextEnlargeIn == 0)
			{
				contextEnlargeIn = (int)pow(2, contextNumBits);
				contextNumBits++;
			}
			// Add wc to the dictionary
			contextDict[contextWc] = contextDictSize++;
			contextW = contextStr;
		}
	}

	// Output the code for w.
	if (!contextW.empty())
	{
		if (contextFlagDict.find(contextW) != contextFlagDict.end())
		{
			if (contextW[0] < 256)
			{
				for (size_t i = 0; i < contextNumBits; i++)
				{
					contextDataVal = (contextDataVal << 1);
					if (contextDataPosition == bitsPerChar - 1)
					{
						contextDataPosition = 0;
						contextData.push_back(func(contextDataVal));
						contextDataVal = 0;
					}
					else
					{
						contextDataPosition++;
					}
				}
				value = contextW[0];
				for (size_t i = 0; i < 8; i++)
				{
					contextDataVal = (contextDataVal << 1) | (value & 1);
					if (contextDataPosition == bitsPerChar - 1)
					{
						contextDataPosition = 0;
						contextData.push_back(func(contextDataVal));
						contextDataVal = 0;
					}
					else
					{
						contextDataPosition++;
					}
					value = value >> 1;
				}
			}
			else
			{
				value = 1;
				for (size_t i = 0; i < contextNumBits; i++)
				{
					contextDataVal = (contextDataVal << 1) | value;
					if (contextDataPosition == bitsPerChar - 1)
					{
						contextDataPosition = 0;
						contextData.push_back(func(contextDataVal));
						contextDataVal = 0;
					}
					else
					{
						contextDataPosition++;
					}
					value = 0;
				}
				value = contextW[0];
				for (size_t i = 0; i < 16; i++)
				{
					contextDataVal = (contextDataVal << 1) | (value & 1);
					if (contextDataPosition == bitsPerChar - 1)
					{
						contextDataPosition = 0;
						contextData.push_back(func(contextDataVal));
						contextDataVal = 0;
					}
					else
					{
						contextDataPosition++;
					}
					value = value >> 1;
				}
			}
			contextEnlargeIn--;
			if (contextEnlargeIn == 0)
			{
				contextEnlargeIn = (int)pow(2, contextNumBits);
				contextNumBits++;
			}
			contextFlagDict.erase(contextW);
		}
		else
		{
			value = contextDict[contextW];
			for (size_t i = 0; i < contextNumBits; i++)
			{
				contextDataVal = (contextDataVal << 1) | (value & 1);
				if (contextDataPosition == bitsPerChar - 1)
				{
					contextDataPosition = 0;
					contextData.push_back(func(contextDataVal));
					contextDataVal = 0;
				}
				else
				{
					contextDataPosition++;
				}
				value = value >> 1;
			}
		}

		contextEnlargeIn--;
		if (contextEnlargeIn == 0)
		{
			contextEnlargeIn = (int)pow(2, contextNumBits);
			contextNumBits++;
		}
	}

	// Mark the end of the stream
	value = 2;
	for (size_t i = 0; i < contextNumBits; i++)
	{
		contextDataVal = (contextDataVal << 1) | (value & 1);
		if (contextDataPosition == bitsPerChar - 1)
		{
			contextDataPosition = 0;
			contextData.push_back(func(contextDataVal));
			contextDataVal = 0;
		}
		else
		{
			contextDataPosition++;
		}
		value = value >> 1;
	}

	// Flush the last char
	while (true)
	{
		contextDataVal = (contextDataVal << 1);
		if (contextDataPosition == bitsPerChar - 1)
		{
			contextData.push_back(func(contextDataVal));
			break;
		}
		else
		{
			contextDataPosition++;
		}
	}

	return contextData;
}